

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O1

TonkResult
tonk_connect(TonkSocket tonkSocket,TonkConnectionConfig config,char *hostname,uint16_t port,
            TonkConnection *connectionOut,TonkJson *errorJsonOut)

{
  undefined8 uVar1;
  ErrorResult *pEVar2;
  TonkResult TVar3;
  Result result;
  size_type __dnew;
  Result success;
  Result local_68;
  undefined1 local_60 [32];
  Result local_40;
  Result local_38;
  
  local_68.Error = (ErrorResult *)0x0;
  if ((hostname == (char *)0x0 || tonkSocket == (TonkSocket)0x0) ||
      connectionOut == (TonkConnection *)0x0) {
    local_60._0_8_ = local_60 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Null parameter","");
    pEVar2 = (ErrorResult *)operator_new(0x38);
    pEVar2->Source = "tonk_connect";
    (pEVar2->Description)._M_dataplus._M_p = (pointer)&(pEVar2->Description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pEVar2->Description,local_60._0_8_,
               (char *)(local_60._8_8_ + local_60._0_8_));
  }
  else {
    *connectionOut = (TonkConnection)0x0;
    if ((config.OnClose == (_func_void_TonkAppContextPtr_TonkConnection_TonkResult_char_ptr *)0x0)
       && (config.OnData !=
           (_func_void_TonkAppContextPtr_TonkConnection_uint32_t_uint8_t_ptr_uint32_t *)0x0 ||
           config.OnTick != (_func_void_TonkAppContextPtr_TonkConnection_uint64_t *)0x0)) {
      local_60._0_8_ = local_60 + 0x10;
      local_40.Error = (ErrorResult *)0x97;
      local_60._0_8_ = std::__cxx11::string::_M_create((ulong *)local_60,(ulong)&local_40);
      local_60._16_8_ = local_40.Error;
      builtin_strncpy((char *)((long)&(((ErrorResult *)(local_60._0_8_ + 0x38))->Description).
                                      field_2 + 7),"ee().  T",8);
      builtin_strncpy((char *)((long)&(((ErrorResult *)(local_60._0_8_ + 0x38))->Description).
                                      field_2 + 0xf),"he appli",8);
      *(undefined8 *)&((ErrorResult *)(local_60._0_8_ + 0x38))->field_0x2f = 0x73206e6f69746163;
      builtin_strncpy((char *)((long)&((ErrorResult *)(local_60._0_8_ + 0x38))->Code + 7),"hould us"
                      ,8);
      builtin_strncpy((char *)((long)&((ErrorResult *)(local_60._0_8_ + 0x70))->Source + 7),
                      "e OnClos",8);
      builtin_strncpy((char *)((long)&(((ErrorResult *)(local_60._0_8_ + 0x70))->Description).
                                      _M_dataplus._M_p + 7),"e() to c",8);
      builtin_strncpy((char *)((long)&(((ErrorResult *)(local_60._0_8_ + 0x70))->Description).
                                      _M_string_length + 7),"all tonk",8);
      builtin_strncpy((char *)((long)&(((ErrorResult *)(local_60._0_8_ + 0x70))->Description).
                                      field_2 + 7),"_free().",8);
      (((ErrorResult *)(local_60._0_8_ + 0x38))->Description)._M_dataplus._M_p =
           (pointer)0x656c6c6163206562;
      (((ErrorResult *)(local_60._0_8_ + 0x38))->Description)._M_string_length = 0x2072657466612064;
      (((ErrorResult *)(local_60._0_8_ + 0x38))->Description).field_2._M_allocated_capacity =
           0x6572665f6b6e6f74;
      builtin_strncpy((char *)((long)&(((ErrorResult *)(local_60._0_8_ + 0x38))->Description).
                                      field_2 + 8),"e().  Th",8);
      *(undefined8 *)&((ErrorResult *)(local_60._0_8_ + 0x38))->Type = 0x63696c7070612065;
      ((ErrorResult *)(local_60._0_8_ + 0x38))->Code = 0x6873206e6f697461;
      ((ErrorResult *)(local_60._0_8_ + 0x70))->Source = (char *)0x65737520646c756f;
      (((ErrorResult *)(local_60._0_8_ + 0x70))->Description)._M_dataplus._M_p =
           (pointer)0x65736f6c436e4f20;
      ((ErrorResult *)local_60._0_8_)->Source = (char *)0x2065736f6c436e4f;
      (((ErrorResult *)local_60._0_8_)->Description)._M_dataplus._M_p = (pointer)0x6220746f6e6e6163;
      (((ErrorResult *)local_60._0_8_)->Description)._M_string_length = 0x203a6c6c756e2065;
      (((ErrorResult *)local_60._0_8_)->Description).field_2._M_allocated_capacity =
           0x616320726568744f;
      builtin_strncpy((char *)((long)&(((ErrorResult *)local_60._0_8_)->Description).field_2 + 8),
                      "llbacks ",8);
      *(undefined8 *)&((ErrorResult *)local_60._0_8_)->Type = 0x6365707320657261;
      ((ErrorResult *)local_60._0_8_)->Code = 0x6e61206465696669;
      ((ErrorResult *)(local_60._0_8_ + 0x38))->Source = (char *)0x20646c756f632064;
      local_60._8_8_ = local_40.Error;
      *(char *)((long)&((ErrorResult *)local_60._0_8_)->Source + (long)local_40.Error) = '\0';
      pEVar2 = (ErrorResult *)operator_new(0x38);
      pEVar2->Source = "ValidateTonkConnectionConfig";
      (pEVar2->Description)._M_dataplus._M_p = (pointer)&(pEVar2->Description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pEVar2->Description,local_60._0_8_,
                 (char *)(local_60._8_8_ + local_60._0_8_));
      pEVar2->Type = Tonk;
      pEVar2->Code = 1;
      local_38.Error = pEVar2;
      if ((ErrorResult *)local_60._0_8_ != (ErrorResult *)(local_60 + 0x10)) {
        operator_delete((void *)local_60._0_8_);
      }
    }
    else {
      local_38.Error = (ErrorResult *)0x0;
    }
    local_68.Error = local_38.Error;
    local_38.Error = (ErrorResult *)0x0;
    tonk::Result::~Result(&local_38);
    if (local_68.Error != (ErrorResult *)0x0) goto LAB_00114c9e;
    if (port != 0) {
      tonk::ApplicationSession::tonk_connect
                ((ApplicationSession *)local_60,config,(char *)tonkSocket,(uint16_t)hostname,
                 (TonkConnection *)(ulong)port);
      local_68.Error = (ErrorResult *)local_60._0_8_;
      local_60._0_8_ = (ErrorResult *)0x0;
      tonk::Result::~Result((Result *)local_60);
      goto LAB_00114c9e;
    }
    local_60._0_8_ = local_60 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Port was not set","");
    pEVar2 = (ErrorResult *)operator_new(0x38);
    pEVar2->Source = "tonk_connect";
    (pEVar2->Description)._M_dataplus._M_p = (pointer)&(pEVar2->Description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pEVar2->Description,local_60._0_8_,
               (char *)(local_60._8_8_ + local_60._0_8_));
  }
  pEVar2->Type = Tonk;
  pEVar2->Code = 2;
  local_40.Error = (ErrorResult *)0x0;
  local_68.Error = pEVar2;
  tonk::Result::~Result(&local_40);
  if ((ErrorResult *)local_60._0_8_ != (ErrorResult *)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_);
  }
LAB_00114c9e:
  if (errorJsonOut != (TonkJson *)0x0) {
    tonk::Result::ToJson_abi_cxx11_((string *)local_60,&local_68);
    uVar1 = local_60._0_8_;
    strncpy(errorJsonOut->JsonString,(char *)local_60._0_8_,0x400);
    errorJsonOut->JsonString[0x3ff] = '\0';
    if ((ErrorResult *)uVar1 != (ErrorResult *)(local_60 + 0x10)) {
      operator_delete((void *)uVar1);
    }
  }
  if (local_68.Error == (ErrorResult *)0x0) {
    TVar3 = Tonk_Success;
  }
  else {
    switch((local_68.Error)->Type) {
    case Tonk:
      TVar3 = (TonkResult)(local_68.Error)->Code;
      break;
    case Siamese:
      TVar3 = Tonk_FECFailed;
      break;
    case Asio:
    case LastErr:
      TVar3 = Tonk_NetworkFailed;
      break;
    case Cymric:
      TVar3 = Tonk_PRNGFailed;
      break;
    default:
      TVar3 = Tonk_Error;
    }
  }
  tonk::Result::~Result(&local_68);
  return TVar3;
}

Assistant:

TONK_EXPORT TonkResult tonk_connect(
    TonkSocket          tonkSocket, // Socket to connect from
    TonkConnectionConfig    config, // Configuration for the connection
    const char*           hostname, // Hostname of the remote host
    uint16_t                  port, // Port for the remote host
    TonkConnection*  connectionOut, // Set to connection on success, else 0
    TonkJson*         errorJsonOut  // Receives detailed error message on error
)
{
    SIAMESE_DEBUG_ASSERT(hostname != nullptr); // Invalid input

    Result result;

    if (!tonkSocket || !hostname || !connectionOut)
        result = Result("tonk_connect", "Null parameter");
    else
    {
        *connectionOut = nullptr;

        result = ValidateTonkConnectionConfig(&config);
        if (result.IsFail())
        {
            TONK_DEBUG_BREAK(); // Invalid input
        }
        else
        {
            ApplicationSession* session = reinterpret_cast<ApplicationSession*>(tonkSocket);

            if (port == 0)
                result = Result("tonk_connect", "Port was not set");
            else
            {
                result = session->tonk_connect(
                    config,
                    hostname,
                    port,
                    connectionOut);
            }
        }
    }

    // Write optional error json object
    if (errorJsonOut)
        SafeCopyCStr(
            errorJsonOut->JsonString,
            TONK_ERROR_JSON_MAX_BYTES,
            result.ToJson().c_str());
    return TonkResultFromDetailedResult(result);
}